

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxMinusSign::Resolve(FxMinusSign *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxConstant *this_01;
  ExpVal val;
  FxExpression *this_00;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar2 = (*this->Operand->_vptr_FxExpression[2])();
      this_00 = (FxExpression *)CONCAT44(extraout_var,iVar2);
      this->Operand = this_00;
      if (this_00 != (FxExpression *)0x0) {
        bVar1 = FxExpression::IsNumeric(this_00);
        if (bVar1) {
          iVar2 = (*this->Operand->_vptr_FxExpression[3])();
          if ((char)iVar2 != '\0') {
            ExpVal::ExpVal(&val,(ExpVal *)(this->Operand + 1));
            iVar2 = (*((val.Type)->super_DObject)._vptr_DObject[0x12])();
            if (iVar2 == 0) {
              this_01 = (FxConstant *)operator_new(0x48);
              FxConstant::FxConstant
                        (this_01,-val.field_1.Int,&(this->super_FxExpression).ScriptPosition);
            }
            else {
              this_01 = (FxConstant *)operator_new(0x48);
              FxConstant::FxConstant
                        (this_01,-(double)CONCAT44(val.field_1._4_4_,val.field_1.Int),
                         &(this->super_FxExpression).ScriptPosition);
            }
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            ExpVal::~ExpVal(&val);
            return &this_01->super_FxExpression;
          }
          (this->super_FxExpression).ValueType = this->Operand->ValueType;
          return &this->super_FxExpression;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxMinusSign *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxMinusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		if (Operand->isConstant())
		{
			ExpVal val = static_cast<FxConstant *>(Operand)->GetValue();
			FxExpression *e = val.Type->GetRegType() == REGT_INT ?
				new FxConstant(-val.Int, ScriptPosition) :
				new FxConstant(-val.Float, ScriptPosition);
			delete this;
			return e;
		}
		ValueType = Operand->ValueType;
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}